

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime_test.cpp
# Opt level: O2

void __thiscall ISPRIME_Negative_Test::TestBody(ISPRIME_Negative_Test *this)

{
  char *message;
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  undefined1 local_88 [8];
  vector<bool,_std::allocator<bool>_> res;
  allocator_type local_38 [8];
  AssertionResult gtest_ar;
  allocator_type local_19;
  
  res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage.
  _0_1_ = isprime(-1);
  res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage.
  _1_1_ = isprime(-0x1475);
  res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage.
  _2_1_ = isprime(-0xefedb1);
  res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage.
  _3_1_ = isprime(-2);
  __l._M_len = 4;
  __l._M_array = (iterator)
                 &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_88,__l,local_38);
  gtest_ar.message_.ptr_._0_4_ = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&gtest_ar.message_;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_00,&local_19);
  testing::internal::
  CmpHelperEQ<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            ((internal *)local_38,"res","(vector<bool> {false, false, false, false})",
             (vector<bool,_std::allocator<bool>_> *)local_88,
             (vector<bool,_std::allocator<bool>_> *)
             &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)
             &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  if (local_38[0] == (allocator_type)0x0) {
    testing::Message::Message
              ((Message *)
               &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/prime_test.cpp"
               ,7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)
               &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&res.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)local_88);
  return;
}

Assistant:

TEST(ISPRIME, Negative) {
	vector<bool> res = {isprime(-1), isprime(-5237), isprime(-15723953), isprime(-2)};
	EXPECT_EQ(res, (vector<bool> {false, false, false, false}));
}